

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O0

Status __thiscall kwssys::Directory::Load(Directory *this,string *name,string *errorMessage)

{
  int *piVar1;
  char *pcVar2;
  string *in_RDX;
  string *in_RSI;
  long *in_RDI;
  dirent *d;
  DIR *dir;
  Directory *in_stack_ffffffffffffff50;
  allocator *paVar3;
  char (*in_stack_ffffffffffffff58) [256];
  vector<kwssys::DirectoryInternals::FileData,_std::allocator<kwssys::DirectoryInternals::FileData>_>
  *in_stack_ffffffffffffff60;
  allocator local_89;
  string local_88 [32];
  dirent *local_68;
  allocator local_49;
  string local_48 [32];
  DIR *local_28;
  string *local_20;
  string *local_18;
  Status local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  Clear(in_stack_ffffffffffffff50);
  piVar1 = __errno_location();
  *piVar1 = 0;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_28 = opendir(pcVar2);
  if (local_28 == (DIR *)0x0) {
    if (local_20 != (string *)0x0) {
      piVar1 = __errno_location();
      pcVar2 = strerror(*piVar1);
      paVar3 = &local_49;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,pcVar2,paVar3);
      std::__cxx11::string::operator=(local_20,local_48);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
    local_8 = Status::POSIX_errno();
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0;
    local_68 = readdir(local_28);
    while (local_68 != (dirent *)0x0) {
      std::
      vector<kwssys::DirectoryInternals::FileData,std::allocator<kwssys::DirectoryInternals::FileData>>
      ::emplace_back<char(&)[256]>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      local_68 = readdir(local_28);
    }
    piVar1 = __errno_location();
    if (*piVar1 == 0) {
      std::__cxx11::string::operator=((string *)(*in_RDI + 0x18),local_18);
      closedir(local_28);
      local_8 = Status::Success();
    }
    else {
      if (local_20 != (string *)0x0) {
        piVar1 = __errno_location();
        pcVar2 = strerror(*piVar1);
        paVar3 = &local_89;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_88,pcVar2,paVar3);
        std::__cxx11::string::operator=(local_20,local_88);
        std::__cxx11::string::~string(local_88);
        std::allocator<char>::~allocator((allocator<char> *)&local_89);
      }
      local_8 = Status::POSIX_errno();
    }
  }
  return local_8;
}

Assistant:

Status Directory::Load(std::string const& name, std::string* errorMessage)
{
  this->Clear();

  errno = 0;
  DIR* dir = opendir(name.c_str());

  if (!dir) {
    if (errorMessage != nullptr) {
      *errorMessage = std::string(strerror(errno));
    }
    return Status::POSIX_errno();
  }

  errno = 0;
  for (kwsys_dirent* d = readdir(dir); d; d = readdir(dir)) {
    this->Internal->Files.emplace_back(d->d_name);
  }
  if (errno != 0) {
    if (errorMessage != nullptr) {
      *errorMessage = std::string(strerror(errno));
    }
    return Status::POSIX_errno();
  }

  this->Internal->Path = name;
  closedir(dir);
  return Status::Success();
}